

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

string * __thiscall
cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *__s;
  char *local_48;
  string pid;
  
  __s = idToString((PolicyID)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pid,__s,(allocator<char> *)&local_48);
  local_48 = idToVersion((PolicyID)this);
  cmStrCat<char_const(&)[8],std::__cxx11::string&,char_const(&)[130],char_const*,char_const(&)[218],std::__cxx11::string&,char_const(&)[23]>
            (__return_storage_ptr__,(char (*) [8])"Policy ",&pid,
             (char (*) [130])
             " may not be set to OLD behavior because this version of CMake no longer supports it.  The policy was introduced in CMake version "
             ,&local_48,
             (char (*) [218])
             ", and use of NEW behavior is now required.\nPlease either update your CMakeLists.txt files to conform to the new behavior or use an older version of CMake that still supports the old behavior.  Run cmake --help-policy "
             ,&pid,(char (*) [23])0x758a52);
  std::__cxx11::string::~string((string *)&pid);
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredAlwaysPolicyError(cmPolicies::PolicyID id)
{
  std::string pid = idToString(id);
  return cmStrCat(
    "Policy ", pid,
    " may not be set to OLD behavior because this "
    "version of CMake no longer supports it.  "
    "The policy was introduced in CMake version ",
    idToVersion(id),
    ", and use of NEW behavior is now required."
    "\n"
    "Please either update your CMakeLists.txt files to conform to "
    "the new behavior or use an older version of CMake that still "
    "supports the old behavior.  Run cmake --help-policy ",
    pid, " for more information.");
}